

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O2

void * PAL_LOADLoadPEFile(HANDLE hFile)

{
  void *ptr;
  char *__s;
  size_t sVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    ptr = MAPMapPEFile(hFile);
    if (ptr == (void *)0x0) {
      ptr = (void *)0x0;
    }
    else {
      __s = getenv("PAL_ForcePEMapFailure");
      if (__s != (char *)0x0) {
        sVar1 = strlen(__s);
        if (sVar1 != 0) {
          if (PAL_InitializeChakraCoreCalled == false) goto LAB_003289f7;
          PAL_LOADUnloadPEFile(ptr);
          ptr = MAPMapPEFile(hFile);
        }
      }
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return ptr;
    }
  }
LAB_003289f7:
  abort();
}

Assistant:

void *
PALAPI
PAL_LOADLoadPEFile(HANDLE hFile)
{
    ENTRY("PAL_LOADLoadPEFile (hFile=%p)\n", hFile);

    void * loadedBase = MAPMapPEFile(hFile);

#ifdef _DEBUG
    if (loadedBase != nullptr)
    {
        char* envVar = getenv("PAL_ForcePEMapFailure");
        if (envVar && strlen(envVar) > 0)
        {
            TRACE("Forcing failure of PE file map, and retry\n");
            PAL_LOADUnloadPEFile(loadedBase); // unload it
            loadedBase = MAPMapPEFile(hFile); // load it again
        }
    }
#endif // _DEBUG

    LOGEXIT("PAL_LOADLoadPEFile returns %p\n", loadedBase);
    return loadedBase;
}